

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

bool __thiscall cmMakefile::IsProjectFile(cmMakefile *this,char *filename)

{
  char *pcVar1;
  bool bVar2;
  string *psVar3;
  byte local_112;
  byte local_f2;
  bool local_ca;
  allocator<char> local_c9;
  string local_c8;
  byte local_a3;
  byte local_a2;
  allocator<char> local_a1;
  string local_a0;
  byte local_7b;
  byte local_7a;
  allocator<char> local_79;
  string local_78;
  allocator<char> local_41;
  string local_40;
  char *local_20;
  char *filename_local;
  cmMakefile *this_local;
  
  local_20 = filename;
  filename_local = (char *)this;
  std::allocator<char>::allocator();
  local_7a = 0;
  local_7b = 0;
  local_a2 = 0;
  local_a3 = 0;
  local_ca = false;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,filename,&local_41);
  psVar3 = GetHomeDirectory_abi_cxx11_(this);
  bVar2 = cmsys::SystemTools::IsSubDirectory(&local_40,psVar3);
  pcVar1 = local_20;
  local_f2 = 1;
  if (!bVar2) {
    std::allocator<char>::allocator();
    local_7a = 1;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,pcVar1,&local_79);
    local_7b = 1;
    psVar3 = GetHomeOutputDirectory_abi_cxx11_(this);
    local_ca = cmsys::SystemTools::IsSubDirectory(&local_78,psVar3);
    pcVar1 = local_20;
    local_112 = 0;
    if (local_ca) {
      std::allocator<char>::allocator();
      local_a2 = 1;
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_a0,pcVar1,&local_a1);
      local_a3 = 1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_c8,"/CMakeFiles",&local_c9);
      bVar2 = cmsys::SystemTools::IsSubDirectory(&local_a0,&local_c8);
      local_112 = bVar2 ^ 0xff;
    }
    local_f2 = local_112;
  }
  this_local._7_1_ = local_f2 & 1;
  if (local_ca != false) {
    std::__cxx11::string::~string((string *)&local_c8);
    std::allocator<char>::~allocator(&local_c9);
  }
  if ((local_a3 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_a0);
  }
  if ((local_a2 & 1) != 0) {
    std::allocator<char>::~allocator(&local_a1);
  }
  if ((local_7b & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_78);
  }
  if ((local_7a & 1) != 0) {
    std::allocator<char>::~allocator(&local_79);
  }
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmMakefile::IsProjectFile(const char* filename) const
{
  return cmSystemTools::IsSubDirectory(filename, this->GetHomeDirectory()) ||
    (cmSystemTools::IsSubDirectory(filename, this->GetHomeOutputDirectory()) &&
     !cmSystemTools::IsSubDirectory(filename, "/CMakeFiles"));
}